

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void cf_chacha20_init_custom
               (cf_chacha20_ctx *ctx,uint8_t *key,size_t nkey,uint8_t *nonce,size_t ncounter)

{
  size_t ncounter_local;
  uint8_t *nonce_local;
  size_t nkey_local;
  uint8_t *key_local;
  cf_chacha20_ctx *ctx_local;
  
  if (ncounter == 0) {
    abort();
  }
  set_key(ctx,key,nkey);
  *(undefined8 *)ctx->nonce = *(undefined8 *)nonce;
  *(undefined8 *)(ctx->nonce + 8) = *(undefined8 *)(nonce + 8);
  ctx->nblock = 0;
  ctx->ncounter = ncounter;
  return;
}

Assistant:

void cf_chacha20_init_custom(cf_chacha20_ctx *ctx, const uint8_t *key, size_t nkey,
                             const uint8_t nonce[16], size_t ncounter)
{
  assert(ncounter > 0);
  set_key(ctx, key, nkey);
  memcpy(ctx->nonce, nonce, sizeof ctx->nonce);
  ctx->nblock = 0;
  ctx->ncounter = ncounter;
}